

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall
DWallScrollInterpolation::DWallScrollInterpolation
          (DWallScrollInterpolation *this,side_t *_side,int _part)

{
  int _part_local;
  side_t *_side_local;
  DWallScrollInterpolation *this_local;
  
  DInterpolation::DInterpolation(&this->super_DInterpolation);
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00a098b0;
  this->side = _side;
  this->part = _part;
  (*(this->super_DInterpolation).super_DObject._vptr_DObject[7])();
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DWallScrollInterpolation::DWallScrollInterpolation(side_t *_side, int _part)
{
	side = _side;
	part = _part;
	UpdateInterpolation ();
	interpolator.AddInterpolation(this);
}